

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp-math.h
# Opt level: O0

uint wabt::interp::IntTruncSat<unsigned_int,double>(double val)

{
  bool bVar1;
  uint uVar2;
  double val_local;
  
  uVar2 = std::isnan(val);
  if ((uVar2 & 1) == 0) {
    bVar1 = CanConvert<unsigned_int,double>((f64)val);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      val_local._4_4_ = (uint)(long)val;
    }
    else {
      bVar1 = std::signbit(val);
      uVar2 = std::numeric_limits<unsigned_int>::min();
      val_local._4_4_ = std::numeric_limits<unsigned_int>::max();
      if (bVar1) {
        val_local._4_4_ = uVar2;
      }
    }
  }
  else {
    val_local._4_4_ = 0;
  }
  return val_local._4_4_;
}

Assistant:

R WABT_VECTORCALL IntTruncSat(T val) {
  if (WABT_UNLIKELY(std::isnan(val))) {
    return 0;
  } else if (WABT_UNLIKELY(!CanConvert<R>(val))) {
    return std::signbit(val) ? std::numeric_limits<R>::min()
                             : std::numeric_limits<R>::max();
  } else {
    return static_cast<R>(val);
  }
}